

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPExternalTransmitter::SetMaximumPacketSize(RTPExternalTransmitter *this,size_t s)

{
  size_t s_local;
  RTPExternalTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x97;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x96;
  }
  else {
    this->maxpacksize = s;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPExternalTransmitter::SetMaximumPacketSize(size_t s)	
{
	if (!init)
		return ERR_RTP_EXTERNALTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOTCREATED;
	}
	maxpacksize = s;
	MAINMUTEX_UNLOCK
	return 0;
}